

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy_allocator.h
# Opt level: O0

page * __thiscall cppcms::impl::buddy_allocator::page_alloc(buddy_allocator *this,int bit_size)

{
  int *piVar1;
  int in_ESI;
  long in_RDI;
  page *unused;
  page *to_split;
  page *result;
  undefined4 in_stack_ffffffffffffffe8;
  page *local_8;
  
  if (*(int *)(in_RDI + 0x208) < in_ESI) {
    local_8 = (page *)0x0;
  }
  else {
    if (*(long *)(in_RDI + (long)in_ESI * 8) == 0) {
      local_8 = page_alloc((buddy_allocator *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),0);
      if (local_8 == (page *)0x0) {
        return (page *)0x0;
      }
      piVar1 = (int *)((long)&local_8->bits + (1L << ((byte)in_ESI & 0x3f)));
      piVar1[4] = 0;
      piVar1[5] = 0;
      piVar1[2] = 0;
      piVar1[3] = 0;
      *piVar1 = in_ESI;
      *(int **)(in_RDI + (long)in_ESI * 8) = piVar1;
    }
    else {
      local_8 = *(page **)(in_RDI + (long)in_ESI * 8);
      *(page **)(in_RDI + (long)in_ESI * 8) = local_8->next;
      if (*(long *)(in_RDI + (long)in_ESI * 8) != 0) {
        *(undefined8 *)(*(long *)(in_RDI + (long)in_ESI * 8) + 0x10) = 0;
      }
    }
    local_8->next = (page *)0x0;
    local_8->prev = (page *)0x0;
    local_8->bits = in_ESI + 0x100;
  }
  return local_8;
}

Assistant:

page *page_alloc(int bit_size)
	{
		LOG("Allocating page %d bits",bit_size);
		if(bit_size > max_bit_size_) {
			LOG("Too big size requested %d > %d",bit_size,max_bit_size_);
			return 0;
		}

		page *result = 0;
		
		if(free_list_[bit_size]==0) {
			LOG("No page for bits %d, splitting",bit_size);
			page *to_split = page_alloc(bit_size + 1);
			if(!to_split)
				return 0;

			page *unused = reinterpret_cast<page *>(reinterpret_cast<char *>(to_split) + (size_t(1)<<bit_size));

			unused->prev = 0;
			unused->next = 0;
			unused->bits = bit_size;
			

			free_list_[bit_size] = unused;

			result = to_split;
			LOG("Got %zx; %zx is spare",(char*)to_split - memory(),(char*)unused - memory());
		}
		else {
			result = free_list_[bit_size];
			free_list_[bit_size]=result->next;
			if(free_list_[bit_size]) 
				free_list_[bit_size]->prev = 0;
			LOG("Using free page %zx, disconnecting",(char*)result - memory());
		}

		result->next = 0;
		result->prev = 0;
		result->bits = bit_size + page_in_use;
		LOG("Result is %zx",(char*)result - memory());
		return result;
	}